

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

bool __thiscall
trieste::detail::InsideStar<7UL>::match(InsideStar<7UL> *this,NodeIt *it,Node *parent,Match *match)

{
  element_type *peVar1;
  int iVar2;
  element_type *peVar3;
  long lVar4;
  
  peVar3 = (parent->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  do {
    if (peVar3 == (element_type *)0x0) {
      return false;
    }
    lVar4 = -0x38;
    do {
      if ((peVar3->type_).def == *(TokenDef **)((long)(this[1].types._M_elems + -3) + lVar4)) {
        peVar1 = (this->super_PatternDef).continuation.
                 super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar2 = (*peVar1->_vptr_PatternDef[4])();
          return SUB41(iVar2,0);
        }
        return true;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0);
    peVar3 = peVar3->parent_;
  } while( true );
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        NodeDef* p = &*parent;

        while (p)
        {
          for (const auto& type : types)
            if (p->type() == type)
              return match_continuation(it, parent, match);

          p = p->parent();
        }

        return false;
      }